

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

void Glucose_QuantifyAigTest(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  SimpSolver *pSVar4;
  SimpSolver *pSVar5;
  SimpSolver *pSVar6;
  uint fHash;
  long lVar7;
  long lVar8;
  long lVar9;
  char *__s;
  long lVar10;
  timespec ts;
  bmcg_sat_solver *pSats [3];
  timespec local_78;
  int local_64;
  SimpSolver *local_60;
  SimpSolver *local_58;
  SimpSolver *local_50;
  SimpSolver *local_48;
  SimpSolver *local_40;
  SimpSolver *local_38;
  
  pSVar4 = glucose_solver_start();
  local_48 = pSVar4;
  pSVar5 = glucose_solver_start();
  local_40 = pSVar5;
  pSVar6 = glucose_solver_start();
  local_38 = pSVar6;
  iVar1 = clock_gettime(3,&local_78);
  if (iVar1 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_78.tv_sec * -1000000;
  }
  iVar1 = p->vCos->nSize;
  if (p->nRegs < iVar1) {
    if (iVar1 < 1) {
LAB_005be408:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar1 = *p->vCos->pArray;
    if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_005be3ca:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    iVar2 = iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff);
    if (-1 < iVar2) {
      local_50 = pSVar6;
      local_64 = bmcg_sat_solver_quantify
                           (&local_48,p,(*(uint *)(p->pObjs + iVar1) >> 0x1d & 1) + iVar2 * 2,0,
                            Gia_ManCiIsToKeep,(void *)0x0,(Vec_Int_t *)0x0);
      iVar1 = clock_gettime(3,&local_78);
      if (iVar1 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
      }
      iVar1 = clock_gettime(3,&local_78);
      if (iVar1 < 0) {
        lVar8 = 1;
      }
      else {
        lVar8 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_78.tv_nsec),8);
        lVar8 = ((lVar8 >> 7) - (lVar8 >> 0x3f)) + local_78.tv_sec * -1000000;
      }
      iVar1 = p->vCos->nSize;
      if (iVar1 <= p->nRegs) goto LAB_005be3e9;
      if (iVar1 < 1) goto LAB_005be408;
      iVar1 = *p->vCos->pArray;
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005be3ca;
      fHash = *(uint *)(p->pObjs + iVar1) & 0x1fffffff;
      iVar2 = iVar1 - fHash;
      local_58 = pSVar5;
      if (-1 < iVar2) {
        local_60 = pSVar4;
        iVar1 = bmcg_sat_solver_quantify2
                          (p,(*(uint *)(p->pObjs + iVar1) >> 0x1d & 1) + iVar2 * 2,fHash,
                           Gia_ManCiIsToKeep,(void *)0x0,(Vec_Int_t *)0x0);
        iVar3 = 3;
        iVar2 = clock_gettime(3,&local_78);
        if (iVar2 < 0) {
          lVar10 = -1;
        }
        else {
          lVar10 = local_78.tv_nsec / 1000 + local_78.tv_sec * 1000000;
        }
        Abc_Print(iVar3,"%s =","Time1");
        Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar9 + lVar7) / 1000000.0);
        Abc_Print(iVar3,"%s =","Time2");
        Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar10 + lVar8) / 1000000.0);
        pSVar4 = local_50;
        iVar2 = local_64;
        iVar3 = bmcg_sat_solver_equiv_overlap_check(local_50,p,local_64,iVar1,1);
        __s = "Verification passed.";
        if (iVar3 == 0) {
          __s = "Verification FAILED.";
        }
        puts(__s);
        Gia_ManAppendCo(p,iVar2);
        Gia_ManAppendCo(p,iVar1);
        (*(local_60->super_Solver)._vptr_Solver[1])();
        (*(local_58->super_Solver)._vptr_Solver[1])();
        (*(pSVar4->super_Solver)._vptr_Solver[1])(pSVar4);
        return;
      }
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
LAB_005be3e9:
  __assert_fail("v < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
}

Assistant:

void Glucose_QuantifyAigTest( Gia_Man_t * p )
{
    bmcg_sat_solver * pSats[3] = { bmcg_sat_solver_start(), bmcg_sat_solver_start(), bmcg_sat_solver_start() };

    abctime clk1 = Abc_Clock();
    int iRes1 = bmcg_sat_solver_quantify( pSats, p, Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 0, Gia_ManCiIsToKeep, NULL, NULL );
    abctime clk1d = Abc_Clock()-clk1;

    abctime clk2 = Abc_Clock();
    int iRes2 = bmcg_sat_solver_quantify2( p, Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 0, Gia_ManCiIsToKeep, NULL, NULL );
    abctime clk2d = Abc_Clock()-clk2;

    Abc_PrintTime( 1, "Time1", clk1d );
    Abc_PrintTime( 1, "Time2", clk2d );

    if ( bmcg_sat_solver_equiv_overlap_check( pSats[2], p, iRes1, iRes2, 1 ) )
        printf( "Verification passed.\n" );
    else
        printf( "Verification FAILED.\n" );

    Gia_ManAppendCo( p, iRes1 );
    Gia_ManAppendCo( p, iRes2 );

    bmcg_sat_solver_stop( pSats[0] );
    bmcg_sat_solver_stop( pSats[1] );
    bmcg_sat_solver_stop( pSats[2] );
}